

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unidim-lipm-dcm-estimator.cpp
# Opt level: O3

void __thiscall
stateObservation::UnidimLipmDcmEstimator::UnidimLipmDcmEstimator
          (UnidimLipmDcmEstimator *this,double dt,double omega_0,double biasDriftStd,double initDcm,
          double initZMP,double initBias,double dcmMeasureErrorStd,double zmpMeasureErrorStd,
          double initDcmUncertainty,double initBiasUncertainty)

{
  LinearKalmanFilter *this_00;
  Vector2 *pVVar1;
  Matrix<double,_2,_2,_0,_2,_2> *pMVar2;
  DstEvaluatorType dstEvaluator;
  Matrix<double,_2,_1,_0,_2,_1> *pMVar3;
  CommaInitializer<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *pCVar4;
  undefined8 *puVar5;
  char *pcVar6;
  ActualDstType actualDst;
  Vector2 x;
  CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> local_a8;
  CommaInitializer<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> local_88;
  double local_60;
  double local_58;
  double local_50;
  Vector2 local_48;
  double local_38;
  Scalar local_30;
  Scalar local_28;
  
  this->omega0_ = omega_0;
  this->dt_ = dt;
  this->biasDriftStd_ = biasDriftStd;
  this->zmpErrorStd_ = zmpMeasureErrorStd;
  this->previousZmp_ = initZMP;
  this_00 = &this->filter_;
  local_60 = initDcm;
  local_58 = dcmMeasureErrorStd;
  local_50 = initBias;
  KalmanFilterBase::KalmanFilterBase(&this_00->super_KalmanFilterBase,2,1,1);
  (this->filter_).super_KalmanFilterBase.super_ZeroDelayObserver.super_ObserverBase.
  _vptr_ObserverBase = (_func_int **)&PTR__LinearKalmanFilter_001b4368;
  (this->filter_).super_KalmanFilterBase.super_StateVectorArithmetics._vptr_StateVectorArithmetics =
       (_func_int **)&PTR_stateSum_001b45c8;
  (this->filter_).d_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_data = (double *)0x0;
  (this->filter_).d_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_rows = 0;
  (this->filter_).d_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_cols = 0;
  (this->filter_).b_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_data = (double *)0x0;
  (this->filter_).b_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_rows = 0;
  (this->filter_).b_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_cols = 0;
  updateMatricesABQ_(this);
  pVVar1 = &this->C_;
  local_a8.m_row = 0;
  local_a8.m_col = 1;
  local_a8.m_currentBlockRows = 1;
  (pVVar1->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.array[0] =
       1.0;
  local_88.m_xpr = (Matrix<double,_2,_2,_0,_2,_2> *)0x3ff0000000000000;
  local_a8.m_xpr = pVVar1;
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::operator_
            (&local_a8,(Scalar *)&local_88);
  if ((local_a8.m_currentBlockRows + local_a8.m_row == 2) &&
     ((double)local_a8.m_col == 4.94065645841247e-324)) {
    (this->R_).super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data.array
    [0] = local_58 * local_58;
    local_a8.m_xpr = (Vector2 *)0x0;
    local_a8.m_row = 0;
    local_a8.m_col = 0;
    local_88.m_xpr = (Matrix<double,_2,_2,_0,_2,_2> *)pVVar1;
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
              ((DenseStorage<double,__1,__1,__1,_0> *)&local_a8,2,1,2);
    Eigen::internal::
    check_for_aliasing<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Transpose<Eigen::Matrix<double,2,1,0,2,1>>>
              ((Matrix<double,__1,__1,_0,__1,__1> *)&local_a8,
               (Transpose<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)&local_88);
    pMVar2 = local_88.m_xpr;
    if (((double)local_a8.m_row != 4.94065645841247e-324) ||
       ((double)local_a8.m_col != 9.88131291682493e-324)) {
      Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                ((DenseStorage<double,__1,__1,__1,_0> *)&local_a8,2,1,2);
      if (((double)local_a8.m_row != 4.94065645841247e-324) ||
         ((double)local_a8.m_col != 9.88131291682493e-324)) {
        pcVar6 = 
        "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, -1>, SrcXprType = Eigen::Transpose<Eigen::Matrix<double, 2, 1>>, T1 = double, T2 = double]"
        ;
        goto LAB_0017fb90;
      }
    }
    ((local_a8.m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.
    m_data.array[0] =
         (((PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)
          &pMVar2->super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>)->m_storage).m_data.
         array[0];
    ((local_a8.m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.
    m_data.array[1] =
         (((PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)
          &pMVar2->super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>)->m_storage).m_data.
         array[1];
    KalmanFilterBase::setC(&this_00->super_KalmanFilterBase,(Cmatrix *)&local_a8);
    free(local_a8.m_xpr);
    local_a8.m_xpr = (Vector2 *)0x0;
    local_a8.m_row = 0;
    local_a8.m_col = 0;
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
              ((DenseStorage<double,__1,__1,__1,_0> *)&local_a8,1,1,1);
    if (((double)local_a8.m_row != 4.94065645841247e-324) ||
       ((double)local_a8.m_col != 4.94065645841247e-324)) {
      Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                ((DenseStorage<double,__1,__1,__1,_0> *)&local_a8,1,1,1);
      if (((double)local_a8.m_row != 4.94065645841247e-324) ||
         ((double)local_a8.m_col != 4.94065645841247e-324)) {
        pcVar6 = 
        "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, -1>, SrcXprType = Eigen::Matrix<double, 1, 1>, T1 = double, T2 = double]"
        ;
        goto LAB_0017fb90;
      }
    }
    ((local_a8.m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.
    m_data.array[0] =
         (this->R_).super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data.
         array[0];
    (*(this->filter_).super_KalmanFilterBase.super_ZeroDelayObserver.super_ObserverBase.
      _vptr_ObserverBase[0x2e])(this_00);
    free(local_a8.m_xpr);
    local_a8.m_xpr = &local_48;
    local_a8.m_row = 0;
    local_a8.m_col = 1;
    local_a8.m_currentBlockRows = 1;
    local_48.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0]
         = local_60;
    Eigen::CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::operator_(&local_a8,&local_50);
    if ((local_a8.m_currentBlockRows + local_a8.m_row == 2) &&
       ((double)local_a8.m_col == 4.94065645841247e-324)) {
      pMVar3 = (Matrix<double,_2,_1,_0,_2,_1> *)malloc(0x10);
      if (((ulong)pMVar3 & 0xf) != 0) {
        __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                      ,"/usr/include/eigen3/Eigen/src/Core/util/Memory.h",0xb9,
                      "void *Eigen::internal::aligned_malloc(std::size_t)");
      }
      if (pMVar3 == (Matrix<double,_2,_1,_0,_2,_1> *)0x0) {
        puVar5 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar5 = operator_delete;
        __cxa_throw(puVar5,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      local_a8.m_row = 2;
      (pMVar3->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.array
      [0] = local_48.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.
            array[0];
      (pMVar3->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.array
      [1] = local_48.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.
            array[1];
      local_a8.m_xpr = pMVar3;
      ZeroDelayObserver::setState((ZeroDelayObserver *)this_00,(StateVector *)&local_a8,0);
      free(local_a8.m_xpr);
      local_a8.m_xpr = (Matrix<double,_2,_1,_0,_2,_1> *)(initDcmUncertainty * initDcmUncertainty);
      local_88.m_row = 0;
      local_88.m_col = 1;
      local_88.m_currentBlockRows = 1;
      local_28 = 0.0;
      local_88.m_xpr = (Matrix<double,_2,_2,_0,_2,_2> *)&local_a8;
      pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::operator_
                         (&local_88,&local_28);
      local_30 = 0.0;
      pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::operator_
                         (pCVar4,&local_30);
      local_38 = initBiasUncertainty * initBiasUncertainty;
      Eigen::CommaInitializer<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::operator_(pCVar4,&local_38);
      if ((local_88.m_currentBlockRows + local_88.m_row == 2) && (local_88.m_col == 2)) {
        local_88.m_xpr = (Matrix<double,_2,_2,_0,_2,_2> *)0x0;
        local_88.m_row = 0;
        local_88.m_col = 0;
        Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                  ((DenseStorage<double,__1,__1,__1,_0> *)&local_88,4,2,2);
        if ((local_88.m_row != 2) || (local_88.m_col != 2)) {
          Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                    ((DenseStorage<double,__1,__1,__1,_0> *)&local_88,4,2,2);
          if ((local_88.m_row != 2) || (local_88.m_col != 2)) {
            pcVar6 = 
            "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, -1>, SrcXprType = Eigen::Matrix<double, 2, 2>, T1 = double, T2 = double]"
            ;
LAB_0017fb90:
            __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                          "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,pcVar6);
          }
        }
        (((PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)
         &(local_88.m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>)->m_storage
        ).m_data.array[0] = (double)local_a8.m_xpr;
        (((PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)
         &(local_88.m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>)->m_storage
        ).m_data.array[1] = (double)local_a8.m_row;
        (((Matrix1 *)((long)local_88.m_xpr + 0x10))->
        super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>).m_storage.m_data.array[0] =
             (double)local_a8.m_col;
        ((Matrix1 *)((long)local_88.m_xpr + 0x10))[1] = (Matrix1)local_a8.m_currentBlockRows;
        KalmanFilterBase::setStateCovariance(&this_00->super_KalmanFilterBase,(Pmatrix *)&local_88);
        free(local_88.m_xpr);
        return;
      }
      pcVar6 = 
      "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, 2, 2>>::finished() [MatrixType = Eigen::Matrix<double, 2, 2>]"
      ;
      goto LAB_0017fbd7;
    }
  }
  pcVar6 = 
  "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, 2, 1>>::finished() [MatrixType = Eigen::Matrix<double, 2, 1>]"
  ;
LAB_0017fbd7:
  __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,pcVar6);
}

Assistant:

UnidimLipmDcmEstimator::UnidimLipmDcmEstimator(double dt,
                                               double omega_0,
                                               double biasDriftStd,
                                               double initDcm,
                                               double initZMP,
                                               double initBias,
                                               double dcmMeasureErrorStd,
                                               double zmpMeasureErrorStd,
                                               double initDcmUncertainty,
                                               double initBiasUncertainty)
: omega0_(omega_0), dt_(dt), biasDriftStd_(biasDriftStd), zmpErrorStd_(zmpMeasureErrorStd), previousZmp_(initZMP),
  filter_(2, 1, 1)
{
  updateMatricesABQ_();
  C_ << 1., 1.;
  R_ << square(dcmMeasureErrorStd);
  filter_.setC(C_.transpose());
  filter_.setMeasurementCovariance(R_);
  Vector2 x;
  x << initDcm, initBias;
  filter_.setState(x, 0);
  Matrix2 P;
  // clang-format off
  P<< square(initDcmUncertainty),  0,
      0,                           square(initBiasUncertainty);
  // clang-format on
  filter_.setStateCovariance(P);
}